

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data.hpp
# Opt level: O2

vector<rect,_std::allocator<rect>_> * __thiscall
WalkerManager::GetRectFromManager
          (vector<rect,_std::allocator<rect>_> *__return_storage_ptr__,WalkerManager *this)

{
  pointer pMVar1;
  reference pvVar2;
  int i;
  ulong __n;
  value_type local_38;
  
  (__return_storage_ptr__->super__Vector_base<rect,_std::allocator<rect>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<rect,_std::allocator<rect>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<rect,_std::allocator<rect>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  for (__n = 0; __n < (ulong)((long)(this->walkers).
                                    super__Vector_base<std::shared_ptr<MWakler>,_std::allocator<std::shared_ptr<MWakler>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->walkers).
                                    super__Vector_base<std::shared_ptr<MWakler>,_std::allocator<std::shared_ptr<MWakler>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 4); __n = __n + 1)
  {
    pvVar2 = std::vector<std::shared_ptr<MWakler>,_std::allocator<std::shared_ptr<MWakler>_>_>::at
                       (&this->walkers,__n);
    pMVar1 = (((pvVar2->super___shared_ptr<MWakler,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->mRects).
             super__Vector_base<Mrect,_std::allocator<Mrect>_>._M_impl.super__Vector_impl_data.
             _M_finish;
    local_38.x1 = pMVar1[-1].x1;
    local_38.y1 = pMVar1[-1].y1;
    local_38.x2 = pMVar1[-1].x2;
    local_38.y2 = pMVar1[-1].y2;
    std::vector<rect,_std::allocator<rect>_>::push_back(__return_storage_ptr__,&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<rect> GetRectFromManager()
    {
        std::vector<rect> retcts;
        //retcts.resize(walkers.size());

        for(int i=0; i<walkers.size(); ++i)
        {
            Mrect r = walkers.at(i)->mRects.back();
            rect r_t{r.x1, r.y1, r.x2, r.y2};
            retcts.push_back(r_t);
        }
        return retcts;
    }